

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall cmDependsC::Scan(cmDependsC *this,istream *is,char *directory,string *fullName)

{
  bool bVar1;
  cmIncludeLines *this_00;
  mapped_type *ppcVar2;
  char *pcVar3;
  byte local_182;
  _Self local_138;
  _Self local_130;
  allocator local_121;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [8];
  UnscannedEntry entry;
  string line;
  cmIncludeLines *newCacheEntry;
  string *fullName_local;
  char *directory_local;
  istream *is_local;
  cmDependsC *this_local;
  
  this_00 = (cmIncludeLines *)operator_new(0x20);
  cmIncludeLines::cmIncludeLines(this_00);
  this_00->Used = true;
  ppcVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
            ::operator[](&this->FileCache,fullName);
  *ppcVar2 = this_00;
  std::__cxx11::string::string((string *)(entry.QuotedLocation.field_2._M_local_buf + 8));
  while (bVar1 = cmsys::SystemTools::GetLineFromStream
                           (is,(string *)((long)&entry.QuotedLocation.field_2 + 8),(bool *)0x0,-1),
        bVar1) {
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->TransformRules);
    if (!bVar1) {
      TransformLine(this,(string *)((long)&entry.QuotedLocation.field_2 + 8));
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::RegularExpression::find(&this->IncludeRegexLine,pcVar3);
    if (bVar1) {
      UnscannedEntry::UnscannedEntry((UnscannedEntry *)local_a0);
      cmsys::RegularExpression::match_abi_cxx11_(&local_c0,&this->IncludeRegexLine,2);
      std::__cxx11::string::operator=((string *)local_a0,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_a0);
      cmsys::RegularExpression::match_abi_cxx11_(&local_e0,&this->IncludeRegexLine,3);
      bVar1 = std::operator==(&local_e0,"\"");
      local_182 = 0;
      if (bVar1) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar3);
        local_182 = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string((string *)&local_e0);
      if ((local_182 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_120,directory,&local_121);
        cmSystemTools::CollapseCombinedPath(&local_100,&local_120,(string *)local_a0);
        std::__cxx11::string::operator=
                  ((string *)(entry.FileName.field_2._M_local_buf + 8),(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::RegularExpression::find(&this->IncludeRegexScan,pcVar3);
      if (bVar1) {
        std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
        push_back((vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_> *
                  )this_00,(value_type *)local_a0);
        local_130._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->Encountered,(key_type *)local_a0);
        local_138._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->Encountered);
        bVar1 = std::operator==(&local_130,&local_138);
        if (bVar1) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->Encountered,(value_type *)local_a0);
          std::
          queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
          ::push(&this->Unscanned,(value_type *)local_a0);
        }
      }
      UnscannedEntry::~UnscannedEntry((UnscannedEntry *)local_a0);
    }
  }
  std::__cxx11::string::~string((string *)(entry.QuotedLocation.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmDependsC::Scan(std::istream& is, const char* directory,
  const std::string& fullName)
{
  cmIncludeLines* newCacheEntry=new cmIncludeLines;
  newCacheEntry->Used=true;
  this->FileCache[fullName]=newCacheEntry;

  // Read one line at a time.
  std::string line;
  while(cmSystemTools::GetLineFromStream(is, line))
    {
    // Transform the line content first.
    if(!this->TransformRules.empty())
      {
      this->TransformLine(line);
      }

    // Match include directives.
    if(this->IncludeRegexLine.find(line.c_str()))
      {
      // Get the file being included.
      UnscannedEntry entry;
      entry.FileName = this->IncludeRegexLine.match(2);
      cmSystemTools::ConvertToUnixSlashes(entry.FileName);
      if(this->IncludeRegexLine.match(3) == "\"" &&
         !cmSystemTools::FileIsFullPath(entry.FileName.c_str()))
        {
        // This was a double-quoted include with a relative path.  We
        // must check for the file in the directory containing the
        // file we are scanning.
        entry.QuotedLocation =
          cmSystemTools::CollapseCombinedPath(directory, entry.FileName);
        }

      // Queue the file if it has not yet been encountered and it
      // matches the regular expression for recursive scanning.  Note
      // that this check does not account for the possibility of two
      // headers with the same name in different directories when one
      // is included by double-quotes and the other by angle brackets.
      // It also does not work properly if two header files with the same
      // name exist in different directories, and both are included from a
      // file their own directory by simply using "filename.h" (#12619)
      // This kind of problem will be fixed when a more
      // preprocessor-like implementation of this scanner is created.
      if (this->IncludeRegexScan.find(entry.FileName.c_str()))
        {
        newCacheEntry->UnscannedEntries.push_back(entry);
        if(this->Encountered.find(entry.FileName) == this->Encountered.end())
          {
          this->Encountered.insert(entry.FileName);
          this->Unscanned.push(entry);
          }
        }
      }
    }
}